

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sssort.c
# Opt level: O0

void sssort64(sauchar_t *T,saidx64_t *PA,saidx64_t *first,saidx64_t *last,saidx64_t *buf,
             saidx64_t bufsize,saidx64_t depth,saidx64_t n,saint_t lastsuffix)

{
  bool bVar1;
  saint_t sVar2;
  long *in_RCX;
  long *in_RDX;
  long in_RSI;
  sauchar_t *in_RDI;
  long *in_R8;
  sauchar_t *in_R9;
  saidx64_t in_stack_00000008;
  long in_stack_00000010;
  int in_stack_00000018;
  saidx64_t PAi [2];
  saidx64_t i;
  saidx64_t limit;
  saidx64_t curbufsize;
  saidx64_t k;
  saidx64_t j;
  saidx64_t *curbuf;
  saidx64_t *middle;
  saidx64_t *b;
  saidx64_t *a;
  saidx64_t in_stack_000001c0;
  saidx64_t *in_stack_000001c8;
  saidx64_t *in_stack_000001d0;
  saidx64_t *in_stack_000001d8;
  sauchar_t *in_stack_000001e0;
  saidx64_t *in_stack_00000888;
  saidx64_t *in_stack_00000890;
  saidx64_t *in_stack_00000898;
  saidx64_t *in_stack_000008a0;
  saidx64_t *in_stack_000008a8;
  sauchar_t *in_stack_000008b0;
  saidx64_t in_stack_000008c0;
  saidx64_t in_stack_000008c8;
  saidx64_t local_88;
  long local_80;
  ulong local_78;
  sauchar_t *local_70;
  sauchar_t *local_68;
  long local_60;
  ulong in_stack_ffffffffffffffa8;
  long *in_stack_ffffffffffffffb0;
  long *middle_00;
  long *in_stack_ffffffffffffffc0;
  long *plVar3;
  sauchar_t *T_00;
  long *local_28;
  long *local_18;
  
  local_18 = in_RDX;
  if (in_stack_00000018 != 0) {
    local_18 = in_RDX + 1;
  }
  T_00 = in_R9;
  if ((((long)in_R9 < 0x400) && ((long)in_R9 < (long)in_RCX - (long)local_18 >> 3)) &&
     (local_70 = (sauchar_t *)ss_isqrt((long)in_RCX - (long)local_18 >> 3),
     (long)in_R9 < (long)local_70)) {
    if (0x400 < (long)local_70) {
      local_70 = (sauchar_t *)0x400;
    }
    local_28 = in_RCX + -(long)local_70;
    middle_00 = local_28;
    T_00 = local_70;
  }
  else {
    local_70 = (sauchar_t *)0x0;
    middle_00 = in_RCX;
    local_28 = in_R8;
  }
  local_78 = 0;
  for (plVar3 = local_18; 0x400 < (long)middle_00 - (long)plVar3 >> 3; plVar3 = plVar3 + 0x400) {
    in_stack_ffffffffffffffc0 = plVar3;
    ss_mintrosort(in_stack_000001e0,in_stack_000001d8,in_stack_000001d0,in_stack_000001c8,
                  in_stack_000001c0);
    local_68 = (sauchar_t *)((long)in_RCX - (long)(in_stack_ffffffffffffffc0 + 0x400) >> 3);
    in_stack_ffffffffffffffb0 = in_stack_ffffffffffffffc0 + 0x400;
    if ((long)local_68 <= (long)T_00) {
      local_68 = T_00;
      in_stack_ffffffffffffffb0 = local_28;
    }
    local_60 = 0x400;
    plVar3 = in_stack_ffffffffffffffc0;
    for (in_stack_ffffffffffffffa8 = local_78; (in_stack_ffffffffffffffa8 & 1) != 0;
        in_stack_ffffffffffffffa8 = (long)in_stack_ffffffffffffffa8 >> 1) {
      ss_swapmerge(in_stack_000008b0,in_stack_000008a8,in_stack_000008a0,in_stack_00000898,
                   in_stack_00000890,in_stack_00000888,in_stack_000008c0,in_stack_000008c8);
      in_stack_ffffffffffffffc0 = in_stack_ffffffffffffffc0 + -local_60;
      local_60 = local_60 << 1;
    }
    local_78 = local_78 + 1;
  }
  ss_mintrosort(in_stack_000001e0,in_stack_000001d8,in_stack_000001d0,in_stack_000001c8,
                in_stack_000001c0);
  local_60 = 0x400;
  for (; local_78 != 0; local_78 = (long)local_78 >> 1) {
    if ((local_78 & 1) != 0) {
      ss_swapmerge(in_stack_000008b0,in_stack_000008a8,in_stack_000008a0,in_stack_00000898,
                   in_stack_00000890,in_stack_00000888,in_stack_000008c0,in_stack_000008c8);
      plVar3 = plVar3 + -local_60;
    }
    local_60 = local_60 << 1;
  }
  if (local_70 != (sauchar_t *)0x0) {
    ss_mintrosort(in_stack_000001e0,in_stack_000001d8,in_stack_000001d0,in_stack_000001c8,
                  in_stack_000001c0);
    ss_inplacemerge(T_00,plVar3,in_stack_ffffffffffffffc0,middle_00,in_stack_ffffffffffffffb0,
                    in_stack_ffffffffffffffa8);
  }
  if (in_stack_00000018 != 0) {
    local_88 = *(saidx64_t *)(in_RSI + local_18[-1] * 8);
    local_80 = in_stack_00000010 + -2;
    local_78 = local_18[-1];
    while( true ) {
      bVar1 = false;
      if ((local_18 < in_RCX) && (bVar1 = true, -1 < *local_18)) {
        sVar2 = ss_compare(in_RDI,&local_88,(saidx64_t *)(in_RSI + *local_18 * 8),in_stack_00000008)
        ;
        bVar1 = 0 < sVar2;
      }
      if (!bVar1) break;
      local_18[-1] = *local_18;
      local_18 = local_18 + 1;
    }
    local_18[-1] = local_78;
  }
  return;
}

Assistant:

void
sssort(const sauchar_t *T, const saidx_t *PA,
       saidx_t *first, saidx_t *last,
       saidx_t *buf, saidx_t bufsize,
       saidx_t depth, saidx_t n, saint_t lastsuffix) {
  saidx_t *a;
#if SS_BLOCKSIZE != 0
  saidx_t *b, *middle, *curbuf;
  saidx_t j, k, curbufsize, limit;
#endif
  saidx_t i;

  if(lastsuffix != 0) { ++first; }

#if SS_BLOCKSIZE == 0
  ss_mintrosort(T, PA, first, last, depth);
#else
  if((bufsize < SS_BLOCKSIZE) &&
      (bufsize < (last - first)) &&
      (bufsize < (limit = ss_isqrt(last - first)))) {
    if(SS_BLOCKSIZE < limit) { limit = SS_BLOCKSIZE; }
    buf = middle = last - limit, bufsize = limit;
  } else {
    middle = last, limit = 0;
  }
  for(a = first, i = 0; SS_BLOCKSIZE < (middle - a); a += SS_BLOCKSIZE, ++i) {
#if SS_INSERTIONSORT_THRESHOLD < SS_BLOCKSIZE
    ss_mintrosort(T, PA, a, a + SS_BLOCKSIZE, depth);
#elif 1 < SS_BLOCKSIZE
    ss_insertionsort(T, PA, a, a + SS_BLOCKSIZE, depth);
#endif
    curbufsize = last - (a + SS_BLOCKSIZE);
    curbuf = a + SS_BLOCKSIZE;
    if(curbufsize <= bufsize) { curbufsize = bufsize, curbuf = buf; }
    for(b = a, k = SS_BLOCKSIZE, j = i; j & 1; b -= k, k <<= 1, j >>= 1) {
      ss_swapmerge(T, PA, b - k, b, b + k, curbuf, curbufsize, depth);
    }
  }
#if SS_INSERTIONSORT_THRESHOLD < SS_BLOCKSIZE
  ss_mintrosort(T, PA, a, middle, depth);
#elif 1 < SS_BLOCKSIZE
  ss_insertionsort(T, PA, a, middle, depth);
#endif
  for(k = SS_BLOCKSIZE; i != 0; k <<= 1, i >>= 1) {
    if(i & 1) {
      ss_swapmerge(T, PA, a - k, a, middle, buf, bufsize, depth);
      a -= k;
    }
  }
  if(limit != 0) {
#if SS_INSERTIONSORT_THRESHOLD < SS_BLOCKSIZE
    ss_mintrosort(T, PA, middle, last, depth);
#elif 1 < SS_BLOCKSIZE
    ss_insertionsort(T, PA, middle, last, depth);
#endif
    ss_inplacemerge(T, PA, first, middle, last, depth);
  }
#endif

  if(lastsuffix != 0) {
    /* Insert last type B* suffix. */
    saidx_t PAi[2]; PAi[0] = PA[*(first - 1)], PAi[1] = n - 2;
    for(a = first, i = *(first - 1);
        (a < last) && ((*a < 0) || (0 < ss_compare(T, &(PAi[0]), PA + *a, depth)));
        ++a) {
      *(a - 1) = *a;
    }
    *(a - 1) = i;
  }
}